

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

bam_hdr_t * sam_hdr_read(htsFile *fp)

{
  htsExactFormat hVar1;
  char *pcVar2;
  int iVar3;
  bam_hdr_t *pbVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  FILE *__stream;
  char *pcVar8;
  kstring_t *str;
  size_t __n;
  size_t __size;
  ulong uVar9;
  char line [2048];
  kstring_t local_868;
  ulong local_848;
  kstring_t *local_840;
  char local_838 [2056];
  
  hVar1 = (fp->format).format;
  if (hVar1 != sam) {
    if (hVar1 == cram) {
      pbVar4 = cram_header_to_bam(((fp->fp).cram)->header);
      return pbVar4;
    }
    if (hVar1 == bam) {
      pbVar4 = bam_hdr_read((fp->fp).bgzf);
      return pbVar4;
    }
    abort();
  }
  str = &fp->line;
  local_868.l = 0;
  local_868.m = 0;
  local_868.s = (char *)0x0;
  __stream = (FILE *)fp;
  iVar3 = hts_getline(fp,2,str);
  if (iVar3 < 0) {
    uVar9 = 0;
LAB_0013d057:
    __stream = (FILE *)fp->fn_aux;
    if (__stream != (FILE *)0x0) {
      __stream = fopen((char *)__stream,"r");
      if (__stream == (FILE *)0x0) {
        return (bam_hdr_t *)0x0;
      }
      pcVar6 = fgets(local_838,0x800,__stream);
      if (pcVar6 != (char *)0x0) {
        do {
          pcVar6 = strtok(local_838,"\t");
          strtok((char *)0x0,"\t");
          ksprintf(&local_868,"@SQ\tSN:%s\tLN:%s\n",pcVar6);
          pcVar6 = fgets(local_838,0x800,__stream);
        } while (pcVar6 != (char *)0x0);
      }
      fclose(__stream);
      uVar9 = local_868.l;
    }
  }
  else {
    local_848 = 0;
    uVar9 = 0;
    pcVar6 = (char *)0x0;
    __size = 0;
    local_840 = str;
    do {
      pcVar8 = (fp->line).s;
      if (*pcVar8 != '@') break;
      if (((3 < str->l) && (pcVar8[1] == 'S')) &&
         (local_848 = local_848 & 0xffffffff, pcVar8[2] == 'Q')) {
        local_848 = 1;
      }
      __n = (size_t)(int)str->l;
      uVar5 = uVar9 + __n + 1;
      pcVar2 = local_868.s;
      if (uVar5 < __size) {
LAB_0013cf88:
        local_868.s = pcVar2;
        memcpy(pcVar6 + uVar9,pcVar8,__n);
        uVar9 = uVar9 + __n;
        pcVar6[uVar9] = '\0';
        __size = local_868.m;
        local_868.l = uVar9;
      }
      else {
        uVar5 = uVar5 >> 1 | uVar5;
        uVar5 = uVar5 >> 2 | uVar5;
        uVar5 = uVar5 >> 4 | uVar5;
        uVar5 = uVar5 >> 8 | uVar5;
        __size = (uVar5 >> 0x10 | uVar5) + 1;
        local_868.m = __size;
        pcVar6 = (char *)realloc(pcVar6,__size);
        pcVar2 = pcVar6;
        if (pcVar6 != (char *)0x0) goto LAB_0013cf88;
      }
      str = local_840;
      pcVar6 = local_868.s;
      uVar5 = uVar9 + 1;
      pcVar8 = local_868.s;
      if (uVar5 < __size) {
LAB_0013d017:
        local_868.s = pcVar8;
        (local_868.s + uVar9)[0] = '\n';
        (local_868.s + uVar9)[1] = '\0';
        uVar9 = uVar5;
        pcVar6 = local_868.s;
        local_868.l = uVar5;
      }
      else {
        uVar7 = uVar5 >> 1 | uVar5;
        uVar7 = uVar7 >> 2 | uVar7;
        uVar7 = uVar7 >> 4 | uVar7;
        uVar7 = uVar7 >> 8 | uVar7;
        __size = (uVar7 >> 0x10 | uVar7) + 1;
        local_868.m = __size;
        pcVar8 = (char *)realloc(local_868.s,__size);
        if (pcVar8 != (char *)0x0) goto LAB_0013d017;
      }
      __stream = (FILE *)fp;
      iVar3 = hts_getline(fp,2,str);
    } while (-1 < iVar3);
    if ((int)local_848 == 0) goto LAB_0013d057;
  }
  iVar3 = (int)__stream;
  if (uVar9 == 0) {
    if (local_868.m < 2) {
      local_868.m = 2;
      pcVar6 = local_868.s;
      pcVar8 = (char *)realloc(local_868.s,2);
      iVar3 = (int)pcVar6;
      uVar9 = local_868.l;
      if (pcVar8 == (char *)0x0) goto LAB_0013d133;
    }
    else {
      uVar9 = 0;
      pcVar8 = local_868.s;
    }
    local_868.s = pcVar8;
    local_868.s[uVar9] = '\0';
  }
LAB_0013d133:
  pbVar4 = sam_hdr_parse(iVar3,local_868.s);
  pbVar4->l_text = (uint32_t)local_868.l;
  pbVar4->text = local_868.s;
  return pbVar4;
}

Assistant:

bam_hdr_t *sam_hdr_read(htsFile *fp)
{
    switch (fp->format.format) {
    case bam:
        return bam_hdr_read(fp->fp.bgzf);

    case cram:
        return cram_header_to_bam(fp->fp.cram->header);

    case sam: {
        kstring_t str;
        bam_hdr_t *h;
        int has_SQ = 0;
        str.l = str.m = 0; str.s = 0;
        while (hts_getline(fp, KS_SEP_LINE, &fp->line) >= 0) {
            if (fp->line.s[0] != '@') break;
            if (fp->line.l > 3 && strncmp(fp->line.s,"@SQ",3) == 0) has_SQ = 1;
            kputsn(fp->line.s, fp->line.l, &str);
            kputc('\n', &str);
        }
        if (! has_SQ && fp->fn_aux) {
            char line[2048];
            FILE *f = fopen(fp->fn_aux, "r");
            if (f == NULL) return NULL;
            while (fgets(line, sizeof line, f)) {
                const char *name = strtok(line, "\t");
                const char *length = strtok(NULL, "\t");
                ksprintf(&str, "@SQ\tSN:%s\tLN:%s\n", name, length);
            }
            fclose(f);
        }
        if (str.l == 0) kputsn("", 0, &str);
        h = sam_hdr_parse(str.l, str.s);
        h->l_text = str.l; h->text = str.s;
        return h;
        }

    default:
        abort();
    }
}